

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::SingleFailureChecker::SingleFailureChecker
          (SingleFailureChecker *this,TestPartResultArray *results,Type type,string *substr)

{
  string *substr_local;
  Type type_local;
  TestPartResultArray *results_local;
  SingleFailureChecker *this_local;
  
  this->results_ = results;
  this->type_ = type;
  std::__cxx11::string::string((string *)&this->substr_,substr);
  return;
}

Assistant:

SingleFailureChecker:: SingleFailureChecker(
    const TestPartResultArray* results,
    TestPartResult::Type type,
    const string& substr)
    : results_(results),
      type_(type),
      substr_(substr) {}